

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall SQCompiler::ForStatement(SQCompiler *this)

{
  long lVar1;
  long lVar2;
  SQInteger SVar3;
  SQUnsignedInteger SVar4;
  SQUnsignedInteger SVar5;
  SQFuncState *pSVar6;
  sqvector<SQInstruction> *this_00;
  SQCompiler *pSVar7;
  long lVar8;
  SQObjectValue SVar9;
  long *in_RDI;
  SQObject SVar10;
  SQInteger oldouters;
  SQInteger i_1;
  SQInteger continuetrg;
  SQInteger __ncontinues__;
  SQInteger __nbreaks__;
  SQInteger i;
  SQInstructionVec exp;
  SQInteger expsize;
  SQInteger expend;
  SQInteger expstart;
  SQInteger jzpos;
  SQInteger jmppos;
  SQScope __oldscope__;
  SQInstruction *in_stack_fffffffffffffe88;
  SQCompiler *in_stack_fffffffffffffe90;
  SQInteger in_stack_fffffffffffffe98;
  SQFuncState *in_stack_fffffffffffffea0;
  SQFuncState *in_stack_fffffffffffffea8;
  SQCompiler *in_stack_fffffffffffffeb0;
  SQInstruction *in_stack_fffffffffffffeb8;
  SQOpcode _op;
  SQFuncState *in_stack_fffffffffffffec0;
  long in_stack_fffffffffffffed8;
  SQFuncState *in_stack_fffffffffffffee0;
  SQCompiler *in_stack_fffffffffffffef0;
  SQUnsignedInteger local_e0;
  SQInteger in_stack_ffffffffffffff30;
  SQCompiler *in_stack_ffffffffffffff38;
  long local_a0;
  sqvector<SQInstruction> local_98;
  long local_80;
  SQInteger local_78;
  SQObjectType local_70;
  undefined1 closeframe;
  SQCompiler *local_48;
  
  Lex(in_stack_fffffffffffffe90);
  lVar8 = in_RDI[0x1d];
  lVar1 = in_RDI[0x1e];
  in_RDI[0x1d] = *(long *)(in_RDI[1] + 0x1c8);
  SVar3 = SQFuncState::GetStackSize((SQFuncState *)0x126d05);
  in_RDI[0x1e] = SVar3;
  Expect(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  if (*in_RDI == 0x11b) {
    LocalDeclStatement(in_stack_fffffffffffffef0);
  }
  else if (*in_RDI != 0x3b) {
    CommaExpr(in_stack_fffffffffffffe90);
    SQFuncState::PopTarget(in_stack_fffffffffffffea0);
  }
  Expect(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  SQFuncState::SnoozeOpt((SQFuncState *)in_RDI[1]);
  SQFuncState::GetCurrentPos((SQFuncState *)0x126dc2);
  local_48 = (SQCompiler *)0xffffffffffffffff;
  if (*in_RDI != 0x3b) {
    CommaExpr(in_stack_fffffffffffffe90);
    SQFuncState::PopTarget(in_stack_fffffffffffffea0);
    SQFuncState::AddInstruction
              (in_stack_fffffffffffffec0,(SQOpcode)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
               (SQInteger)in_stack_fffffffffffffeb0,(SQInteger)in_stack_fffffffffffffea8,
               (SQInteger)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    local_48 = (SQCompiler *)SQFuncState::GetCurrentPos((SQFuncState *)0x126e42);
  }
  Expect(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  SQFuncState::SnoozeOpt((SQFuncState *)in_RDI[1]);
  SVar3 = SQFuncState::GetCurrentPos((SQFuncState *)0x126e8f);
  pSVar7 = (SQCompiler *)(SVar3 + 1);
  if (*in_RDI != 0x29) {
    CommaExpr(in_stack_fffffffffffffe90);
    SQFuncState::PopTarget(in_stack_fffffffffffffea0);
  }
  SVar10 = Expect(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  SVar9 = SVar10._unVal;
  local_70 = SVar10._type;
  SQFuncState::SnoozeOpt((SQFuncState *)in_RDI[1]);
  local_78 = SQFuncState::GetCurrentPos((SQFuncState *)0x126f0f);
  local_80 = (local_78 - (long)pSVar7) + 1;
  sqvector<SQInstruction>::sqvector(&local_98);
  closeframe = (undefined1)((ulong)SVar9 >> 0x38);
  if (0 < local_80) {
    for (local_a0 = 0; closeframe = (undefined1)((ulong)SVar9 >> 0x38), local_a0 < local_80;
        local_a0 = local_a0 + 1) {
      SQFuncState::GetInstruction
                ((SQFuncState *)in_stack_fffffffffffffe90,(SQInteger)in_stack_fffffffffffffe88);
      sqvector<SQInstruction>::push_back
                ((sqvector<SQInstruction> *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    }
    SQFuncState::PopInstructions(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  }
  SVar4 = sqvector<long_long>::size((sqvector<long_long> *)(in_RDI[1] + 0x48));
  SVar5 = sqvector<long_long>::size((sqvector<long_long> *)(in_RDI[1] + 0x60));
  sqvector<long_long>::push_back
            ((sqvector<long_long> *)in_stack_fffffffffffffe90,(longlong *)in_stack_fffffffffffffe88)
  ;
  sqvector<long_long>::push_back
            ((sqvector<long_long> *)in_stack_fffffffffffffe90,(longlong *)in_stack_fffffffffffffe88)
  ;
  Statement(pSVar7,(bool)closeframe);
  SQFuncState::GetCurrentPos((SQFuncState *)0x1270da);
  if (0 < local_80) {
    for (local_e0 = 0; (long)local_e0 < local_80; local_e0 = local_e0 + 1) {
      in_stack_fffffffffffffed8 = in_RDI[1];
      in_stack_fffffffffffffee0 =
           (SQFuncState *)sqvector<SQInstruction>::operator[](&local_98,local_e0);
      SQFuncState::AddInstruction(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    }
  }
  _op = (SQOpcode)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  pSVar6 = (SQFuncState *)in_RDI[1];
  SQFuncState::GetCurrentPos((SQFuncState *)0x127192);
  SQFuncState::AddInstruction
            (pSVar6,_op,(SQInteger)in_stack_fffffffffffffeb0,(SQInteger)in_stack_fffffffffffffea8,
             (SQInteger)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  if (0 < (long)local_48) {
    in_stack_fffffffffffffea8 = (SQFuncState *)in_RDI[1];
    SVar3 = SQFuncState::GetCurrentPos((SQFuncState *)0x1271f3);
    SQFuncState::SetIntructionParam
              (pSVar6,SVar3,(SQInteger)local_48,(SQInteger)in_stack_fffffffffffffea8);
    _op = (SQOpcode)((ulong)SVar3 >> 0x20);
    in_stack_fffffffffffffeb0 = local_48;
  }
  lVar2 = *(long *)(in_RDI[1] + 0x1c8);
  pSVar7 = (SQCompiler *)SQFuncState::GetStackSize((SQFuncState *)0x127246);
  if ((pSVar7 != (SQCompiler *)in_RDI[0x1e]) &&
     (SQFuncState::SetStackSize(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8),
     lVar2 != *(long *)(in_RDI[1] + 0x1c8))) {
    SQFuncState::AddInstruction
              (pSVar6,_op,(SQInteger)in_stack_fffffffffffffeb0,(SQInteger)in_stack_fffffffffffffea8,
               (SQInteger)pSVar7,in_stack_fffffffffffffe98);
  }
  in_RDI[0x1d] = lVar8;
  in_RDI[0x1e] = lVar1;
  pSVar6 = (SQFuncState *)sqvector<long_long>::size((sqvector<long_long> *)(in_RDI[1] + 0x48));
  lVar8 = (long)pSVar6 - SVar4;
  this_00 = (sqvector<SQInstruction> *)
            sqvector<long_long>::size((sqvector<long_long> *)(in_RDI[1] + 0x60));
  if (0 < (long)((long)this_00 - SVar5)) {
    ResolveContinues(pSVar7,pSVar6,(SQInteger)this_00,(SQInteger)in_stack_fffffffffffffe88);
  }
  if (0 < lVar8) {
    ResolveBreaks(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,(SQInteger)pSVar7);
  }
  sqvector<long_long>::pop_back((sqvector<long_long> *)(in_RDI[1] + 0x170));
  sqvector<long_long>::pop_back((sqvector<long_long> *)(in_RDI[1] + 0x188));
  sqvector<SQInstruction>::~sqvector(this_00);
  return;
}

Assistant:

void ForStatement()
    {
        Lex();
        BEGIN_SCOPE();
        Expect(_SC('('));
        if(_token == TK_LOCAL) LocalDeclStatement();
        else if(_token != _SC(';')){
            CommaExpr();
            _fs->PopTarget();
        }
        Expect(_SC(';'));
        _fs->SnoozeOpt();
        SQInteger jmppos = _fs->GetCurrentPos();
        SQInteger jzpos = -1;
        if(_token != _SC(';')) { CommaExpr(); _fs->AddInstruction(_OP_JZ, _fs->PopTarget()); jzpos = _fs->GetCurrentPos(); }
        Expect(_SC(';'));
        _fs->SnoozeOpt();
        SQInteger expstart = _fs->GetCurrentPos() + 1;
        if(_token != _SC(')')) {
            CommaExpr();
            _fs->PopTarget();
        }
        Expect(_SC(')'));
        _fs->SnoozeOpt();
        SQInteger expend = _fs->GetCurrentPos();
        SQInteger expsize = (expend - expstart) + 1;
        SQInstructionVec exp;
        if(expsize > 0) {
            for(SQInteger i = 0; i < expsize; i++)
                exp.push_back(_fs->GetInstruction(expstart + i));
            _fs->PopInstructions(expsize);
        }
        BEGIN_BREAKBLE_BLOCK()
        Statement();
        SQInteger continuetrg = _fs->GetCurrentPos();
        if(expsize > 0) {
            for(SQInteger i = 0; i < expsize; i++)
                _fs->AddInstruction(exp[i]);
        }
        _fs->AddInstruction(_OP_JMP, 0, jmppos - _fs->GetCurrentPos() - 1, 0);
        if(jzpos>  0) _fs->SetIntructionParam(jzpos, 1, _fs->GetCurrentPos() - jzpos);
        END_SCOPE();

        END_BREAKBLE_BLOCK(continuetrg);
    }